

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::ObjectIterator::first(ObjectIterator *this,bool useSequentialIteration)

{
  byte *pbVar1;
  bool bVar2;
  ulong uVar3;
  ValueLength VVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  
  if (this->_size != 0) {
    pbVar1 = (this->_slice)._start;
    if (*pbVar1 == 0x14) {
      uVar3 = 0;
      bVar5 = 0;
      pbVar7 = pbVar1;
      do {
        pbVar7 = pbVar7 + 1;
        uVar3 = uVar3 + ((ulong)(*pbVar7 & 0x7f) << (bVar5 & 0x3f));
        bVar5 = bVar5 + 7;
      } while ((char)*pbVar7 < '\0');
      lVar6 = 2;
      if (0x7f < uVar3) {
        do {
          lVar6 = lVar6 + 1;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar3 >> 7;
        } while (bVar2);
      }
      return pbVar1 + lVar6;
    }
    if (useSequentialIteration) {
      VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                         ,*pbVar1);
      return pbVar1 + VVar4;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

[[nodiscard]] uint8_t const* first(bool useSequentialIteration) const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x0a);  // no empty object allowed here
    if (head == 0x14) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    } else if (useSequentialIteration) {
      return _slice.start() + _slice.findDataOffset(head);
    }
    return nullptr;
  }